

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
::~cubeb_resampler_speex
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
           *this)

{
  cubeb_resampler_speex_one_way<short> *pcVar1;
  
  (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b848;
  pcVar1 = (this->output_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
  if (pcVar1 != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*pcVar1->_vptr_cubeb_resampler_speex_one_way[1])();
  }
  (this->output_processor)._M_t.
  super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl =
       (cubeb_resampler_speex_one_way<short> *)0x0;
  pcVar1 = (this->input_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
  if (pcVar1 != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*pcVar1->_vptr_cubeb_resampler_speex_one_way[1])();
  }
  (this->input_processor)._M_t.
  super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl =
       (cubeb_resampler_speex_one_way<short> *)0x0;
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor,
                      OutputProcessor>::~cubeb_resampler_speex()
{
}